

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_CheckLOF(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  double dVar1;
  player_t *ppVar2;
  double dVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  AActor *other;
  subsector_t *psVar8;
  uint uVar9;
  int selector;
  char *pcVar10;
  AActor *origin;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  void *local_1c8;
  void *local_1c0;
  double local_1a0;
  double local_198;
  DVector3 local_178;
  VMReturn *local_158;
  double local_150;
  double local_148;
  ActorFlags local_13c;
  undefined1 local_138 [16];
  double local_128;
  LOFData lof_data;
  FTraceResults trace;
  PClass *pPVar7;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_003d81a9;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d8199:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d81a9:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xfd6,
                  "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  origin = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_003d7959;
    pPVar7 = (origin->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar5 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar5);
      (origin->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar11 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar4 && bVar11) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar11 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar4) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar11) {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d81a9;
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_003d8199;
LAB_003d7959:
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d82d2:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd7,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar9 = param[1].field_0.i;
LAB_003d79b1:
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d82f1:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd8,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar6 = (undefined4)*(undefined8 *)&param[2].field_0;
    uVar14 = (undefined4)((ulong)*(undefined8 *)&param[2].field_0 >> 0x20);
LAB_003d79c2:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d8282:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfd9,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar12 = (undefined4)*(undefined8 *)&param[3].field_0;
    uVar13 = (undefined4)((ulong)*(undefined8 *)&param[3].field_0 >> 0x20);
LAB_003d79d3:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d8263:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfda,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_1c0 = param[4].field_0.field_1.a;
LAB_003d79ea:
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d8244:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdb,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_1c8 = param[5].field_0.field_1.a;
LAB_003d7a01:
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d8225:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdc,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    dVar15 = param[6].field_0.f;
LAB_003d7a12:
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d8206:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdd,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_198 = param[7].field_0.f;
LAB_003d7a29:
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d81e7:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfde,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar5 = param[8].field_0.i;
LAB_003d7a3e:
    local_1a0 = (double)CONCAT44(uVar14,uVar6);
    local_150 = (double)CONCAT44(uVar13,uVar12);
    if (param[9].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d81c8:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xfdf,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d82d2;
    }
    uVar9 = param[1].field_0.i;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003d79b1;
    }
    if (param[2].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d82f1;
    }
    local_1a0 = param[2].field_0.f;
    uVar6 = SUB84(local_1a0,0);
    uVar14 = (undefined4)((ulong)local_1a0 >> 0x20);
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003d79c2;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d8282;
    }
    local_150 = *(double *)&param[3].field_0;
    uVar12 = SUB84(local_150,0);
    uVar13 = (undefined4)((ulong)local_150 >> 0x20);
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003d79d3;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d8263;
    }
    local_1c0 = (void *)param[4].field_0.f;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003d79ea;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d8244;
    }
    local_1c8 = (void *)param[5].field_0.f;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003d7a01;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d8225;
    }
    dVar15 = param[6].field_0.f;
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003d7a12;
    }
    if (param[7].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d8206;
    }
    local_198 = param[7].field_0.f;
    if ((uint)numparam < 9) {
      param = defaultparam->Array;
      goto LAB_003d7a29;
    }
    if (param[8].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d81e7;
    }
    iVar5 = param[8].field_0.i;
    if (numparam == 9) {
      param = defaultparam->Array;
      goto LAB_003d7a3e;
    }
    if (param[9].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d81c8;
    }
  }
  dVar1 = param[9].field_0.f;
  selector = 0x13;
  if (iVar5 != 0) {
    selector = iVar5;
  }
  other = COPY_AAPTR(origin,selector);
  if ((uVar9 >> 0x13 & 1) != 0) {
    ppVar2 = origin->player;
    if (ppVar2 == (player_t *)0x0) {
      dVar15 = dVar15 * origin->Height;
    }
    else {
      dVar15 = dVar15 * (ppVar2->mo->super_AActor).Height * ppVar2->crouchfactor;
    }
  }
  if ((uVar9 >> 0x14 & 1) != 0) {
    dVar1 = dVar1 * origin->radius;
    local_198 = local_198 * origin->radius;
  }
  local_178.Z = (dVar15 - origin->Floorclip) + (origin->__Pos).Z;
  local_178.X = (origin->__Pos).X;
  local_178.Y = (origin->__Pos).Y;
  if ((uVar9 >> 0x12 & 1) == 0) {
    ppVar2 = origin->player;
    if (ppVar2 == (player_t *)0x0) {
      dVar16 = 8.0;
    }
    else {
      dVar16 = ppVar2->mo->AttackZOffset * ppVar2->crouchfactor;
    }
    local_178.Z = local_178.Z + origin->Height * 0.5 + dVar16;
  }
  if (other == (AActor *)0x0) {
    if ((uVar9 >> 0xc & 1) == 0) {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1040,
                      "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      goto LAB_003d8068;
    }
    dVar15 = (origin->Angles).Pitch.Degrees;
    local_158 = ret;
    dVar16 = FFastTrig::sin(&fasttrig,
                            ((double)local_1c0 + (origin->Angles).Yaw.Degrees) * 11930464.711111112
                            + 6755399441055744.0);
    dVar3 = FFastTrig::cos(&fasttrig,dVar16);
    P_GetOffsetPosition((origin->__Pos).X,(origin->__Pos).Y,local_198 * dVar16 + dVar1 * dVar3,
                        dVar1 * dVar16 - local_198 * dVar3);
    local_178.X = (double)trace.Sector;
    local_178.Y = (double)trace._8_8_;
  }
  else {
    if (((0.0 < local_1a0) && ((uVar9 & 0x2000) == 0)) &&
       (dVar16 = AActor::Distance3D(origin,other,false), local_1a0 < dVar16)) {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x100f,
                      "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
LAB_003d8068:
      if (ret->RegType == '\0') {
        *(undefined4 *)ret->Location = 0;
        return 1;
      }
      goto LAB_003d82a3;
    }
    if ((uVar9 & 2) == 0) {
      AActor::AngleTo((AActor *)&trace,origin,SUB81(other,0));
      uVar6 = SUB84(trace.Sector,0);
      uVar14 = (undefined4)((ulong)trace.Sector >> 0x20);
    }
    else {
      dVar16 = (origin->Angles).Yaw.Degrees;
      uVar6 = SUB84(dVar16,0);
      uVar14 = (undefined4)((ulong)dVar16 >> 0x20);
    }
    local_148 = FFastTrig::sin(&fasttrig,
                               (double)CONCAT44(uVar14,uVar6) * 11930464.711111112 +
                               6755399441055744.0);
    dVar16 = FFastTrig::cos(&fasttrig,local_148);
    P_GetOffsetPosition((origin->__Pos).X,(origin->__Pos).Y,local_198 * local_148 + dVar1 * dVar16,
                        dVar1 * local_148 - local_198 * dVar16);
    local_178.X = (double)trace.Sector;
    local_178.Y = (double)trace._8_8_;
    dVar1 = AActor::Distance2D(origin,other,false);
    if ((uVar9 & 1) == 0) {
      dVar16 = (other->Height * 0.5 + (other->__Pos).Z) - local_178.Z;
      if ((uVar9 >> 0x16 & 1) != 0) {
        dVar16 = dVar15 + dVar16;
      }
      local_158 = ret;
      dVar15 = c_atan2(dVar16,dVar1);
      dVar15 = dVar15 * -57.29577951308232;
    }
    else {
      dVar15 = (origin->Angles).Pitch.Degrees;
      local_158 = ret;
    }
  }
  dVar15 = FFastTrig::cos(&fasttrig,
                          ((double)local_1c8 + dVar15) * 11930464.711111112 + 6755399441055744.0);
  dVar1 = FFastTrig::cos(&fasttrig,dVar15);
  dVar16 = FFastTrig::sin(&fasttrig,dVar1);
  local_128 = FFastTrig::sin(&fasttrig,dVar16);
  local_128 = -local_128;
  local_138._8_4_ = SUB84(dVar16 * dVar15,0);
  local_138._0_8_ = dVar1 * dVar15;
  local_138._12_4_ = (int)((ulong)(dVar16 * dVar15) >> 0x20);
  psVar8 = P_PointInSubsector(local_178.X,local_178.Y);
  uVar6 = SUB84(local_1a0,0);
  uVar14 = (undefined4)((ulong)local_1a0 >> 0x20);
  if ((local_1a0 == 0.0) && (!NAN(local_1a0))) {
    uVar6 = (undefined4)
            *(undefined8 *)(&DAT_005f9120 + (ulong)(origin->player == (player_t *)0x0) * 8);
    uVar14 = (undefined4)
             ((ulong)*(undefined8 *)(&DAT_005f9120 + (ulong)(origin->player == (player_t *)0x0) * 8)
             >> 0x20);
  }
  lof_data.BadActor = false;
  local_13c.Value = 0xffffffff;
  lof_data.Self = origin;
  lof_data.Target = other;
  lof_data.Flags = uVar9;
  Trace(&local_178,psVar8->sector,(DVector3 *)local_138,(double)CONCAT44(uVar14,uVar6),&local_13c,
        0x8000,origin,&trace,8,CheckLOFTraceFunc,&lof_data);
  if ((trace.HitType == TRACE_HitActor) ||
     ((((uVar9 >> 0x15 & 1) != 0 && (trace.HitType != TRACE_HitNone)) &&
      (lof_data.BadActor == false)))) {
    if ((local_150 <= 0.0) || (local_150 <= trace.Distance)) {
      if ((trace.Actor != (AActor *)0x0 && trace.HitType == TRACE_HitActor) &&
         (lof_data.BadActor == false)) {
        if ((uVar9 >> 0x17 & 1) != 0) {
          (origin->target).field_0.p = trace.Actor;
        }
        if ((uVar9 >> 0x18 & 1) != 0) {
          (origin->master).field_0.p = trace.Actor;
        }
        if ((uVar9 >> 0x19 & 1) != 0) {
          (origin->tracer).field_0.p = trace.Actor;
        }
      }
      if (numret < 1) {
        return 0;
      }
      if (local_158 == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x106e,
                      "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      uVar6 = 1;
      if (local_158->RegType != '\0') goto LAB_003d82a3;
      goto LAB_003d8031;
    }
    if (numret < 1) {
      return 0;
    }
    if (local_158 == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1066,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (numret < 1) {
      return 0;
    }
    if (local_158 == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1070,
                    "int AF_AActor_CheckLOF(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  if (local_158->RegType != '\0') {
LAB_003d82a3:
    __assert_fail("RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                  ,0x13f,"void VMReturn::SetInt(int)");
  }
  uVar6 = 0;
LAB_003d8031:
  *(undefined4 *)local_158->Location = uVar6;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckLOF)
{
	// Check line of fire

	/*
		Not accounted for / I don't know how it works: FLOORCLIP
	*/

	AActor *target;
	DVector3 pos;
	DVector3 vel;

	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)			
	PARAM_FLOAT_DEF	(range)			
	PARAM_FLOAT_DEF	(minrange)		
	PARAM_ANGLE_DEF	(angle)			
	PARAM_ANGLE_DEF	(pitch)			
	PARAM_FLOAT_DEF	(offsetheight)	
	PARAM_FLOAT_DEF	(offsetwidth)	
	PARAM_INT_DEF	(ptr_target)	
	PARAM_FLOAT_DEF	(offsetforward)	

	DAngle ang;

	target = COPY_AAPTR(self, ptr_target == AAPTR_DEFAULT ? AAPTR_TARGET|AAPTR_PLAYER_GETTARGET|AAPTR_NULL : ptr_target); // no player-support by default

	if (flags & CLOFF_MUL_HEIGHT)
	{
		if (self->player != NULL)
		{
			// Synced with hitscan: self->player->mo->height is strangely conscientious about getting the right actor for player
			offsetheight *= self->player->mo->Height * self->player->crouchfactor;
		}
		else
		{
			offsetheight *= self->Height;
		}
	}
	if (flags & CLOFF_MUL_WIDTH)
	{
		offsetforward *= self->radius;
		offsetwidth *= self->radius;
}
		
	pos = self->PosPlusZ(offsetheight - self->Floorclip);

		if (!(flags & CLOFF_FROMBASE))
		{ // default to hitscan origin

			// Synced with hitscan: self->Height is strangely NON-conscientious about getting the right actor for player
			pos.Z += self->Height *0.5;
			if (self->player != NULL)
			{
				pos.Z += self->player->mo->AttackZOffset * self->player->crouchfactor;
			}
			else
			{
				pos.Z += 8;
			}
		}

		if (target)
		{
			if (range > 0 && !(flags & CLOFF_CHECKPARTIAL))
			{
				double distance = self->Distance3D(target);
				if (distance > range)
				{
					ACTION_RETURN_BOOL(false);
				}
			}

			if (flags & CLOFF_NOAIM_HORZ)
			{
				ang = self->Angles.Yaw;
			}
			else ang = self->AngleTo (target);
				
			angle += ang;

			double s = ang.Sin();
			double c = ang.Cos();
				
			DVector2 xy = self->Vec2Offset(offsetforward * c + offsetwidth * s, offsetforward * s - offsetwidth * c);

			pos.X = xy.X;
			pos.Y = xy.Y;

			double xydist = self->Distance2D(target);
			if (flags & CLOFF_NOAIM_VERT)
			{
				pitch += self->Angles.Pitch;
			}
			else if (flags & CLOFF_AIM_VERT_NOOFFSET)
			{
				pitch -= VecToAngle(xydist, target->Center() - pos.Z + offsetheight);
			}
			else
			{
				pitch -= VecToAngle(xydist, target->Center() - pos.Z);
			}
		}
		else if (flags & CLOFF_ALLOWNULL)
		{
			angle += self->Angles.Yaw;
			pitch += self->Angles.Pitch;

			double s = angle.Sin();
			double c = angle.Cos();

			DVector2 xy = self->Vec2Offset(offsetforward * c + offsetwidth * s, offsetforward * s - offsetwidth * c);

			pos.X = xy.X;
			pos.Y = xy.Y;
		}
		else
		{
			ACTION_RETURN_BOOL(false);
		}

		double cp = pitch.Cos();

		vel = { cp * angle.Cos(), cp * angle.Sin(), -pitch.Sin() };

	/* Variable set:

		jump, flags, target
		pos (trace point of origin)
		vel (trace unit vector)
		range
	*/

	sector_t *sec = P_PointInSector(pos);

	if (range == 0)
	{
		range = (self->player != NULL) ? PLAYERMISSILERANGE : MISSILERANGE;
	}

	FTraceResults trace;
	LOFData lof_data;

	lof_data.Self = self;
	lof_data.Target = target;
	lof_data.Flags = flags;
	lof_data.BadActor = false;

	Trace(pos, sec, vel, range, ActorFlags::FromInt(0xFFFFFFFF), ML_BLOCKEVERYTHING, self, trace, TRACE_PortalRestrict,
		CheckLOFTraceFunc, &lof_data);

	if (trace.HitType == TRACE_HitActor ||
		((flags & CLOFF_JUMP_ON_MISS) && !lof_data.BadActor && trace.HitType != TRACE_HitNone))
	{
		if (minrange > 0 && trace.Distance < minrange)
		{
			ACTION_RETURN_BOOL(false);
		}
		if ((trace.HitType == TRACE_HitActor) && (trace.Actor != NULL) && !(lof_data.BadActor))
		{
			if (flags & (CLOFF_SETTARGET))	self->target = trace.Actor;
			if (flags & (CLOFF_SETMASTER))	self->master = trace.Actor;
			if (flags & (CLOFF_SETTRACER))	self->tracer = trace.Actor;
		}
		ACTION_RETURN_BOOL(true);
	}
	ACTION_RETURN_BOOL(false);
}